

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

StatementSyntax * __thiscall
slang::parsing::Parser::parseAssertionStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  Token zero_00;
  Token hash_00;
  Token hash_01;
  Token closeParen;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token openParen_00;
  Token finalKeyword;
  Token finalKeyword_00;
  Token keyword_00;
  bool bVar1;
  undefined1 uVar2;
  ConcurrentAssertionStatementSyntax *pCVar3;
  Info *this_00;
  long lVar4;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_00;
  long lVar5;
  ImmediateAssertionStatementSyntax *pIVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  SourceLocation in_RDI;
  Token zero_01;
  ActionBlockSyntax *actionBlock;
  ParenthesizedExpressionSyntax *parenExpr;
  ExpressionSyntax *expr;
  Token openParen;
  Token zero;
  Token hash;
  DeferredAssertionSyntax *deferred;
  Token keyword;
  TokenKind nextKind;
  SyntaxKind assertionKind;
  undefined4 in_stack_fffffffffffffd88;
  uint32_t in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  uint32_t in_stack_fffffffffffffd94;
  undefined6 in_stack_fffffffffffffd98;
  TokenKind in_stack_fffffffffffffd9e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffda0;
  ParserBase *in_stack_fffffffffffffdb0;
  Info *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 uVar7;
  DeferredAssertionSyntax *in_stack_fffffffffffffdd0;
  ParenthesizedExpressionSyntax *in_stack_fffffffffffffdd8;
  undefined6 in_stack_fffffffffffffde0;
  byte in_stack_fffffffffffffde6;
  logic_t in_stack_fffffffffffffde7;
  undefined7 in_stack_fffffffffffffdf0;
  DiagSubsystem in_stack_fffffffffffffe04;
  DiagCode code;
  undefined8 in_stack_fffffffffffffe18;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffe20;
  undefined8 local_128;
  undefined8 local_120;
  NamedLabelSyntax *in_stack_ffffffffffffff20;
  Parser *in_stack_ffffffffffffff28;
  AttrList in_stack_ffffffffffffff30;
  Token local_b8;
  Token local_a8;
  DeferredAssertionSyntax *local_98;
  Token local_90;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  Token local_50;
  Token local_40;
  TokenKind local_2e;
  undefined4 local_2c;
  undefined8 local_18;
  undefined8 local_10;
  
  kind = (TokenKind)((ulong)in_stack_fffffffffffffe18 >> 0x30);
  local_2c = 0;
  local_18 = in_RDX;
  local_10 = in_RCX;
  local_40 = ParserBase::peek((ParserBase *)
                              CONCAT26(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98),
                              in_stack_fffffffffffffd94);
  local_2e = local_40.kind;
  local_50 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  code.code = local_50.kind;
  code.subsystem = in_stack_fffffffffffffe04;
  if (local_50.kind == AssertKeyword) {
    if (local_2e == PropertyKeyword) {
      local_60 = local_18;
      local_58 = local_10;
      pCVar3 = parseConcurrentAssertion
                         (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                          in_stack_ffffffffffffff30);
      return &pCVar3->super_StatementSyntax;
    }
    local_2c = 0xed;
  }
  else if (local_50.kind == AssumeKeyword) {
    if (local_2e == PropertyKeyword) {
      local_70 = local_18;
      local_68 = local_10;
      pCVar3 = parseConcurrentAssertion
                         (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                          in_stack_ffffffffffffff30);
      return &pCVar3->super_StatementSyntax;
    }
    local_2c = 0xef;
  }
  else {
    if ((local_2e == PropertyKeyword) || (local_2e == SequenceKeyword)) {
      local_80 = local_18;
      local_78 = local_10;
      pCVar3 = parseConcurrentAssertion
                         (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                          in_stack_ffffffffffffff30);
      return &pCVar3->super_StatementSyntax;
    }
    local_2c = 0xf0;
  }
  local_90 = ParserBase::consume(in_stack_fffffffffffffdb0);
  local_98 = (DeferredAssertionSyntax *)0x0;
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffda0._M_extent_value,
                           in_stack_fffffffffffffd9e);
  if (bVar1) {
    local_a8 = ParserBase::consume(in_stack_fffffffffffffdb0);
    local_b8 = ParserBase::expect(in_stack_fffffffffffffe20,kind);
    bVar1 = Token::isMissing(&local_b8);
    uVar2 = !bVar1;
    Token::intValue((Token *)CONCAT26(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98));
    SVInt::SVInt<int>((SVInt *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                      in_stack_fffffffffffffd8c);
    in_stack_fffffffffffffde7 =
         SVInt::operator!=((SVInt *)CONCAT26(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98),
                           (SVInt *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    in_stack_fffffffffffffde6 = operator&&(false,(logic_t)0x0);
    SVInt::~SVInt((SVInt *)in_stack_fffffffffffffda0._M_extent_value);
    SVInt::~SVInt((SVInt *)in_stack_fffffffffffffda0._M_extent_value);
    if ((in_stack_fffffffffffffde6 & 1) != 0) {
      Token::location(&local_b8);
      ParserBase::addDiag((ParserBase *)CONCAT17(uVar2,in_stack_fffffffffffffdf0),code,in_RDI);
    }
    in_stack_fffffffffffffdd8 = (ParenthesizedExpressionSyntax *)((long)in_RDI + 0xe0);
    Token::Token((Token *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    in_stack_fffffffffffffd88 = (undefined4)local_128;
    in_stack_fffffffffffffd8c = (uint32_t)((ulong)local_128 >> 0x20);
    in_stack_fffffffffffffd90 = (undefined4)local_120;
    in_stack_fffffffffffffd94 = (uint32_t)((ulong)local_120 >> 0x20);
    hash_00.rawLen._2_2_ = in_stack_fffffffffffffd9e;
    hash_00._0_6_ = in_stack_fffffffffffffd98;
    hash_00.info = (Info *)in_stack_fffffffffffffda0._M_extent_value;
    zero_00.info._0_4_ = in_stack_fffffffffffffd90;
    zero_00._0_8_ = local_128;
    zero_00.info._4_4_ = in_stack_fffffffffffffd94;
    finalKeyword.info = in_stack_fffffffffffffdb8;
    finalKeyword._0_8_ = in_stack_fffffffffffffdb0;
    local_98 = slang::syntax::SyntaxFactory::deferredAssertion
                         ((SyntaxFactory *)0x8d8342,hash_00,zero_00,finalKeyword);
  }
  else {
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffda0._M_extent_value,
                             in_stack_fffffffffffffd9e);
    if (bVar1) {
      in_stack_fffffffffffffdd0 = (DeferredAssertionSyntax *)((long)in_RDI + 0xe0);
      Token::Token((Token *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      Token::Token((Token *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      zero_01 = ParserBase::consume(in_stack_fffffffffffffdb0);
      in_stack_fffffffffffffd88 = zero_01._0_4_;
      in_stack_fffffffffffffd8c = zero_01.rawLen;
      in_stack_fffffffffffffd90 = zero_01.info._0_4_;
      in_stack_fffffffffffffd94 = zero_01.info._4_4_;
      hash_01.rawLen._2_2_ = in_stack_fffffffffffffd9e;
      hash_01._0_6_ = in_stack_fffffffffffffd98;
      hash_01.info = (Info *)in_stack_fffffffffffffda0._M_extent_value;
      finalKeyword_00.info = in_stack_fffffffffffffdb8;
      finalKeyword_00._0_8_ = in_stack_fffffffffffffdb0;
      local_98 = slang::syntax::SyntaxFactory::deferredAssertion
                           ((SyntaxFactory *)0x8d83ed,hash_01,zero_01,finalKeyword_00);
    }
  }
  ParserBase::expect(in_stack_fffffffffffffe20,kind);
  this_00 = (Info *)parseExpression((Parser *)
                                    CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  lVar4 = (long)in_RDI + 0xe0;
  ParserBase::expect(in_stack_fffffffffffffe20,kind);
  openParen_00.info = this_00;
  openParen_00.kind = (short)lVar4;
  openParen_00._2_1_ = (char)((ulong)lVar4 >> 0x10);
  openParen_00.numFlags.raw = (char)((ulong)lVar4 >> 0x18);
  openParen_00.rawLen = (int)((ulong)lVar4 >> 0x20);
  closeParen.rawLen._2_2_ = in_stack_fffffffffffffd9e;
  closeParen._0_6_ = in_stack_fffffffffffffd98;
  closeParen.info = (Info *)in_stack_fffffffffffffda0._M_extent_value;
  slang::syntax::SyntaxFactory::parenthesizedExpression
            ((SyntaxFactory *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             openParen_00,
             (ExpressionSyntax *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             closeParen);
  attributes_00 =
       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
       parseActionBlock((Parser *)in_stack_fffffffffffffda0._M_extent_value);
  lVar5 = (long)in_RDI + 0xe0;
  elements._M_ptr._6_2_ = in_stack_fffffffffffffd9e;
  elements._M_ptr._0_6_ = in_stack_fffffffffffffd98;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffda0._M_extent_value;
  uVar7 = local_2c;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),elements);
  keyword_00.info._0_4_ = in_stack_fffffffffffffdc0;
  keyword_00.kind = (short)lVar5;
  keyword_00._2_1_ = (char)((ulong)lVar5 >> 0x10);
  keyword_00.numFlags.raw = (char)((ulong)lVar5 >> 0x18);
  keyword_00.rawLen = (int)((ulong)lVar5 >> 0x20);
  keyword_00.info._4_4_ = uVar7;
  pIVar6 = slang::syntax::SyntaxFactory::immediateAssertionStatement
                     ((SyntaxFactory *)this_00,(SyntaxKind)((ulong)lVar4 >> 0x20),
                      (NamedLabelSyntax *)in_stack_fffffffffffffda0._M_extent_value,attributes_00,
                      keyword_00,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,
                      (ActionBlockSyntax *)
                      CONCAT17(in_stack_fffffffffffffde7.value,
                               CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
  return &pIVar6->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseAssertionStatement(NamedLabelSyntax* label, AttrList attributes) {
    // figure out what kind of assertion we're looking at; concurrent assertions
    // are involved and get their own handling
    SyntaxKind assertionKind = SyntaxKind::Unknown;
    TokenKind nextKind = peek(1).kind;
    switch (peek().kind) {
        case TokenKind::AssertKeyword:
            if (nextKind == TokenKind::PropertyKeyword)
                return parseConcurrentAssertion(label, attributes);
            assertionKind = SyntaxKind::ImmediateAssertStatement;
            break;
        case TokenKind::AssumeKeyword:
            if (nextKind == TokenKind::PropertyKeyword)
                return parseConcurrentAssertion(label, attributes);
            assertionKind = SyntaxKind::ImmediateAssumeStatement;
            break;
        case TokenKind::CoverKeyword:
            if (nextKind == TokenKind::PropertyKeyword || nextKind == TokenKind::SequenceKeyword)
                return parseConcurrentAssertion(label, attributes);
            assertionKind = SyntaxKind::ImmediateCoverStatement;
            break;
        default:
            SLANG_UNREACHABLE;
    }

    Token keyword = consume();
    DeferredAssertionSyntax* deferred = nullptr;
    if (peek(TokenKind::Hash)) {
        auto hash = consume();
        auto zero = expect(TokenKind::IntegerLiteral);
        if (!zero.isMissing() && zero.intValue() != 0)
            addDiag(diag::DeferredDelayMustBeZero, zero.location());
        deferred = &factory.deferredAssertion(hash, zero, Token());
    }
    else if (peek(TokenKind::FinalKeyword)) {
        deferred = &factory.deferredAssertion(Token(), Token(), consume());
    }

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& expr = parseExpression();
    auto& parenExpr = factory.parenthesizedExpression(openParen, expr,
                                                      expect(TokenKind::CloseParenthesis));
    auto& actionBlock = parseActionBlock();
    return factory.immediateAssertionStatement(assertionKind, label, attributes, keyword, deferred,
                                               parenExpr, actionBlock);
}